

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser_error parse_shape_effect_msg(parser *p)

{
  void *pvVar1;
  char *s2;
  char *pcVar2;
  long *local_28;
  effect *effect;
  player_shape *shape;
  parser *p_local;
  
  pvVar1 = parser_priv(p);
  if (pvVar1 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    local_28 = *(long **)((long)pvVar1 + 0xf8);
    if (local_28 == (long *)0x0) {
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
    else {
      for (; *local_28 != 0; local_28 = (long *)*local_28) {
      }
      pcVar2 = (char *)local_28[6];
      s2 = parser_getstr(p,"text");
      pcVar2 = string_append(pcVar2,s2);
      local_28[6] = (long)pcVar2;
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_shape_effect_msg(struct parser *p) {
	struct player_shape *shape = parser_priv(p);
	struct effect *effect;

	if (!shape) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	/* If there is no effect, assume that this is human and not parser error. */
	effect = shape->effect;
	if (effect == NULL) {
		return PARSE_ERROR_NONE;
	}
	while (effect->next) effect = effect->next;

	effect->msg = string_append(effect->msg, parser_getstr(p, "text"));
	return PARSE_ERROR_NONE;
}